

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall
QCss::ValueExtractor::extractFont(ValueExtractor *this,QFont *font,int *fontSizeAdjustment)

{
  Property PVar1;
  DeclarationData *pDVar2;
  Value *pVVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  int i;
  ulong uVar8;
  int i_1;
  uint uVar9;
  ulong uVar10;
  Capitalization caps;
  long lVar11;
  long in_FS_OFFSET;
  Value local_90;
  undefined1 local_68 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fontExtracted == 0) {
    uVar9 = 0;
    for (uVar8 = 0; uVar8 < (ulong)(this->declarations).d.size; uVar8 = uVar8 + 1) {
      pDVar2 = (this->declarations).d.ptr[uVar8].d.d.ptr;
      uVar7 = (pDVar2->values).d.size;
      if (uVar7 == 0) goto switchD_005418ab_caseD_65;
      pVVar3 = (pDVar2->values).d.ptr;
      PVar1 = pDVar2->propertyId;
      if (PVar1 - Font < 5) {
        switch(PVar1) {
        case Font:
          QFont::setStyle(font,StyleNormal);
          QFont::setWeight(font,Normal);
          *fontSizeAdjustment = -0xff;
          lVar11 = 0;
          for (uVar7 = 0; uVar10 = (pDVar2->values).d.size, uVar7 < uVar10; uVar7 = uVar7 + 1) {
            bVar4 = setFontStyleFromValue
                              ((Value *)((long)&((pDVar2->values).d.ptr)->type + lVar11),font);
            if ((!bVar4) &&
               (bVar4 = setFontWeightFromValue
                                  ((Value *)((long)&((pDVar2->values).d.ptr)->type + lVar11),font),
               !bVar4)) {
              uVar10 = (pDVar2->values).d.size;
              break;
            }
            lVar11 = lVar11 + 0x28;
          }
          if (uVar7 < uVar10) {
            Value::Value((Value *)local_68,(Value *)((long)&((pDVar2->values).d.ptr)->type + lVar11)
                        );
            setFontSizeFromValue((Value *)local_68,font,fontSizeAdjustment);
            ::QVariant::~QVariant((QVariant *)&aStack_60);
            uVar7 = (ulong)((int)uVar7 + 1);
            uVar10 = (pDVar2->values).d.size;
          }
          if ((long)(int)uVar7 < (long)uVar10) {
            setFontFamilyFromValues(&pDVar2->values,font,(int)uVar7);
          }
          uVar9 = 1;
          goto switchD_005418ab_caseD_65;
        case FontFamily:
          setFontFamilyFromValues(&pDVar2->values,font,0);
          break;
        case FontSize:
          Value::Value(&local_90,pVVar3);
          setFontSizeFromValue(&local_90,font,fontSizeAdjustment);
          ::QVariant::~QVariant(&local_90.variant);
          break;
        case FontStyle:
          setFontStyleFromValue(pVVar3,font);
          break;
        case FontWeight:
          setFontWeightFromValue(pVVar3,font);
        }
        goto LAB_00541c17;
      }
      switch(PVar1) {
      case FontVariant:
        uVar9 = 1;
        if (pVVar3->type == KnownIdentifier) {
          caps = MixedCase;
          iVar6 = ::QVariant::toInt((bool *)&pVVar3->variant);
          if (iVar6 != 1) {
            if (iVar6 != 0x31) goto LAB_00541c9f;
            caps = SmallCaps;
          }
LAB_00541c94:
          QFont::setCapitalization(font,caps);
LAB_00541c9f:
          uVar9 = 1;
        }
        break;
      case TextTransform:
        uVar9 = 1;
        if (pVVar3->type == KnownIdentifier) {
          caps = MixedCase;
          iVar6 = ::QVariant::toInt((bool *)&pVVar3->variant);
          if (iVar6 != 0x27) {
            if (iVar6 == 0x33) {
              caps = AllLowercase;
            }
            else {
              if (iVar6 != 0x32) goto LAB_00541c9f;
              caps = AllUppercase;
            }
          }
          goto LAB_00541c94;
        }
        break;
      case QtListNumberPrefix:
      case QtListNumberSuffix:
      case LineHeight:
      case QtLineHeightType:
      case QtForegroundTextureCacheKey:
      case QtIcon:
        break;
      case FontKerning:
        uVar9 = 1;
        if (pVVar3->type == KnownIdentifier) {
          iVar6 = ::QVariant::toInt((bool *)&pVVar3->variant);
          if (iVar6 == 0x27) {
            bVar4 = false;
          }
          else {
            if (iVar6 != 1) break;
            bVar4 = true;
          }
          QFont::setKerning(font,bVar4);
        }
        break;
      case LetterSpacing:
        aStack_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        aStack_60.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toString();
        cVar5 = QString::endsWith((QLatin1String *)local_68,2);
        if (cVar5 == '\0') {
          cVar5 = QString::endsWith((QLatin1String *)local_68,2);
          if (cVar5 != '\0') {
            QString::chop((longlong)local_68);
            QString::toDouble((bool *)local_68);
          }
        }
        else {
          QString::chop((longlong)local_68);
          QString::toDouble((bool *)local_68);
        }
        goto LAB_00541c0f;
      case WordSpacing:
        aStack_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        aStack_60.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::toString();
        cVar5 = QString::endsWith((QLatin1String *)local_68,2);
        if (cVar5 != '\0') {
          QString::chop((longlong)local_68);
          QString::toDouble((bool *)local_68);
        }
LAB_00541c0f:
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
LAB_00541c17:
        uVar9 = 1;
        break;
      default:
        if (PVar1 == TextDecoration) {
          lVar11 = 8;
          for (uVar10 = 0; uVar10 < uVar7; uVar10 = uVar10 + 1) {
            pVVar3 = (pDVar2->values).d.ptr;
            if (*(int *)((long)pVVar3 + lVar11 + -8) == 6) {
              iVar6 = ::QVariant::toInt((bool *)((long)&pVVar3->type + lVar11));
              if (iVar6 == 0x27) {
                QFont::setUnderline(font,false);
                QFont::setOverline(font,false);
                bVar4 = false;
LAB_005419da:
                QFont::setStrikeOut(font,bVar4);
              }
              else if (iVar6 == 0xf) {
                QFont::setOverline(font,true);
              }
              else {
                if (iVar6 == 0x10) {
                  bVar4 = true;
                  goto LAB_005419da;
                }
                if (iVar6 == 0xe) {
                  QFont::setUnderline(font,true);
                }
              }
            }
            uVar7 = (pDVar2->values).d.size;
            lVar11 = lVar11 + 0x28;
          }
          goto LAB_00541c9f;
        }
      }
switchD_005418ab_caseD_65:
    }
    QFont::operator=(&this->f,font);
    this->adjustment = *fontSizeAdjustment;
    this->fontExtracted = 2 - uVar9;
  }
  else {
    QFont::operator=(font,&this->f);
    *fontSizeAdjustment = this->adjustment;
    uVar9 = (uint)(this->fontExtracted == 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SUB41(uVar9,0);
  }
  __stack_chk_fail();
}

Assistant:

bool ValueExtractor::extractFont(QFont *font, int *fontSizeAdjustment)
{
    if (fontExtracted) {
        *font = f;
        *fontSizeAdjustment = adjustment;
        return fontExtracted == 1;
    }

    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        if (decl.d->values.isEmpty())
            continue;
        const QCss::Value &val = decl.d->values.at(0);
        switch (decl.d->propertyId) {
            case FontSize: setFontSizeFromValue(val, font, fontSizeAdjustment); break;
            case FontStyle: setFontStyleFromValue(val, font); break;
            case FontWeight: setFontWeightFromValue(val, font); break;
            case FontFamily: setFontFamilyFromValues(decl.d->values, font); break;
            case FontKerning: setFontKerningFromValue(val, font); break;
            case TextDecoration: setTextDecorationFromValues(decl.d->values, font); break;
            case Font: parseShorthandFontProperty(decl.d->values, font, fontSizeAdjustment); break;
            case FontVariant: setFontVariantFromValue(val, font); break;
            case TextTransform: setTextTransformFromValue(val, font); break;
            case LetterSpacing: setLetterSpacingFromValue(val, font); break;
            case WordSpacing: setWordSpacingFromValue(val, font); break;
            default: continue;
        }
        hit = true;
    }

    f = *font;
    adjustment = *fontSizeAdjustment;
    fontExtracted = hit ? 1 : 2;
    return hit;
}